

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::(anonymous_namespace)::jacobiRotateRight<1,2,Imath_3_2::Matrix44<double>>
               (Matrix44<double> *A,BaseType_conflict s,BaseType_conflict tau)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  Matrix44<double> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  T nu2;
  T nu1;
  uint i;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    uVar3 = Matrix44<double>::dimensions();
    if (uVar3 <= local_1c) break;
    pdVar4 = Matrix44<double>::operator[](in_RDI,local_1c);
    dVar1 = pdVar4[1];
    pdVar4 = Matrix44<double>::operator[](in_RDI,local_1c);
    dVar2 = pdVar4[2];
    pdVar4 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar4[1] = -in_XMM0_Qa * (in_XMM1_Qa * dVar1 + dVar2) + pdVar4[1];
    pdVar4 = Matrix44<double>::operator[](in_RDI,local_1c);
    pdVar4[2] = in_XMM0_Qa * (-in_XMM1_Qa * dVar2 + dVar1) + pdVar4[2];
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

inline void
jacobiRotateRight (
    TM& A, const typename TM::BaseType s, const typename TM::BaseType tau)
{
    typedef typename TM::BaseType T;

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
    {
        const T nu1 = A[i][j];
        const T nu2 = A[i][k];
        A[i][j] -= s * (nu2 + tau * nu1);
        A[i][k] += s * (nu1 - tau * nu2);
    }
}